

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::Session::~Session(Session *this)

{
  Session *in_RDI;
  
  ~Session(in_RDI);
  operator_delete(in_RDI);
  return;
}

Assistant:

~Session() {
            Catch::cleanUp();
        }